

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QString,_QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData>
          (Node<QString,_QMimeTypeXMLData> *this,QMimeTypeXMLData *args)

{
  bool bVar1;
  qsizetype qVar2;
  Data *pDVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  Data *pDVar11;
  char16_t *pcVar12;
  Data *pDVar13;
  QString *pQVar14;
  QArrayData *data;
  Data<QHashPrivate::Node<QString,_QString>_> *__old_val;
  long in_FS_OFFSET;
  QHash<QString,_QString> local_a8;
  QArrayData *local_a0;
  char16_t *pcStack_98;
  qsizetype local_90;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = args->hasGlobDeleteAll;
  qVar2 = (args->name).d.size;
  pDVar3 = (args->localeComments).d;
  (args->name).d.size = 0;
  (args->localeComments).d = (Data *)0x0;
  qVar4 = (args->genericIconName).d.size;
  (args->genericIconName).d.size = 0;
  qVar5 = (args->iconName).d.size;
  (args->iconName).d.size = 0;
  qVar6 = (args->globPatterns).d.size;
  (args->globPatterns).d.size = 0;
  (this->value).hasGlobDeleteAll = bVar1;
  pDVar7 = (args->name).d.d;
  pcVar8 = (args->name).d.ptr;
  (args->name).d.d = (Data *)0x0;
  (args->name).d.ptr = (char16_t *)0x0;
  (this->value).name.d.size = qVar2;
  local_a8.d = (Data *)0x0;
  pDVar9 = (args->genericIconName).d.d;
  pcVar10 = (args->genericIconName).d.ptr;
  pDVar11 = (args->iconName).d.d;
  pcVar12 = (args->iconName).d.ptr;
  pDVar13 = (args->globPatterns).d.d;
  pQVar14 = (args->globPatterns).d.ptr;
  (args->genericIconName).d.d = (Data *)0x0;
  (args->genericIconName).d.ptr = (char16_t *)0x0;
  (args->iconName).d.d = (Data *)0x0;
  (args->iconName).d.ptr = (char16_t *)0x0;
  (args->globPatterns).d.d = (Data *)0x0;
  (args->globPatterns).d.ptr = (QString *)0x0;
  data = &((this->value).name.d.d)->super_QArrayData;
  (this->value).name.d.d = pDVar7;
  (this->value).name.d.ptr = pcVar8;
  local_58.d = (Data *)(this->value).localeComments.d;
  (this->value).localeComments.d = pDVar3;
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)&local_58);
  local_a0 = &((this->value).genericIconName.d.d)->super_QArrayData;
  pcStack_98 = (this->value).genericIconName.d.ptr;
  (this->value).genericIconName.d.d = pDVar9;
  (this->value).genericIconName.d.ptr = pcVar10;
  local_90 = (this->value).genericIconName.d.size;
  (this->value).genericIconName.d.size = qVar4;
  local_88 = &((this->value).iconName.d.d)->super_QArrayData;
  pcStack_80 = (this->value).iconName.d.ptr;
  (this->value).iconName.d.d = pDVar11;
  (this->value).iconName.d.ptr = pcVar12;
  local_78 = (this->value).iconName.d.size;
  (this->value).iconName.d.size = qVar5;
  local_70.d = (Data *)0x0;
  local_70.ptr = (QString *)0x0;
  local_70.size = 0;
  local_58.d = (this->value).globPatterns.d.d;
  local_58.ptr = (this->value).globPatterns.d.ptr;
  (this->value).globPatterns.d.d = pDVar13;
  (this->value).globPatterns.d.ptr = pQVar14;
  local_58.size = (this->value).globPatterns.d.size;
  (this->value).globPatterns.d.size = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_a8);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }